

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcDistributionControlElement::~IfcDistributionControlElement
          (IfcDistributionControlElement *this)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  
  *(undefined8 *)this = 0x93d110;
  *(undefined8 *)&this->field_0x180 = 0x93d228;
  *(undefined8 *)&this->field_0x88 = 0x93d138;
  *(undefined8 *)&this->field_0x98 = 0x93d160;
  *(undefined8 *)&this->field_0xd0 = 0x93d188;
  *(undefined8 *)&this->field_0x100 = 0x93d1b0;
  *(undefined8 *)&this->field_0x138 = 0x93d1d8;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcDistributionControlElement,_1UL>).
  _vptr_ObjectHelper = (_func_int **)0x93d200;
  puVar2 = *(undefined1 **)
            &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcDistributionControlElement,_1UL>)
             .field_0x10;
  puVar1 = &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcDistributionControlElement,_1UL>).
            field_0x20;
  if (puVar2 != puVar1) {
    operator_delete(puVar2,*(long *)puVar1 + 1);
  }
  IfcElement::~IfcElement((IfcElement *)this,&PTR_construction_vtable_24__0093d248);
  return;
}

Assistant:

IfcDistributionControlElement() : Object("IfcDistributionControlElement") {}